

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,xmlRegAtomPtr atom,
                        xmlRegStatePtr target,int counter,int count)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  xmlRegTrans *pxVar5;
  int *piVar6;
  uint uVar7;
  char *extra;
  
  if (state == (xmlRegStatePtr)0x0) {
    ctxt->error = 0x5aa;
    extra = "add state: state is NULL";
  }
  else {
    if (target != (xmlRegStatePtr)0x0) {
      uVar1 = state->nbTrans;
      lVar4 = (ulong)uVar1 * 0x18 + -8;
      uVar7 = uVar1;
      while( true ) {
        if ((int)uVar7 < 1) {
          iVar2 = state->maxTrans;
          if ((long)iVar2 == 0) {
            state->maxTrans = 8;
            pxVar5 = (xmlRegTrans *)(*xmlMalloc)(0xc0);
            state->trans = pxVar5;
            if (pxVar5 == (xmlRegTrans *)0x0) {
              xmlRegexpErrMemory(ctxt,"adding transition");
              state->maxTrans = 0;
              return;
            }
          }
          else {
            pxVar5 = state->trans;
            if (iVar2 <= (int)uVar1) {
              state->maxTrans = iVar2 * 2;
              pxVar5 = (xmlRegTrans *)(*xmlRealloc)(pxVar5,(long)iVar2 * 0x30);
              if (pxVar5 == (xmlRegTrans *)0x0) {
                xmlRegexpErrMemory(ctxt,"adding transition");
                state->maxTrans = state->maxTrans / 2;
                return;
              }
              state->trans = pxVar5;
            }
          }
          iVar2 = state->nbTrans;
          pxVar5[iVar2].atom = atom;
          pxVar5[iVar2].to = target->no;
          pxVar5[iVar2].counter = counter;
          pxVar5[iVar2].count = count;
          pxVar5[iVar2].nd = 0;
          state->nbTrans = iVar2 + 1;
          iVar2 = state->no;
          iVar3 = target->maxTransTo;
          if ((long)iVar3 == 0) {
            target->maxTransTo = 8;
            piVar6 = (int *)(*xmlMalloc)(0x20);
            target->transTo = piVar6;
            if (piVar6 == (int *)0x0) {
              xmlRegexpErrMemory(ctxt,"adding transition");
              target->maxTransTo = 0;
              return;
            }
          }
          else if (target->nbTransTo < iVar3) {
            piVar6 = target->transTo;
          }
          else {
            target->maxTransTo = iVar3 * 2;
            piVar6 = (int *)(*xmlRealloc)(target->transTo,(long)iVar3 << 3);
            if (piVar6 == (int *)0x0) {
              xmlRegexpErrMemory(ctxt,"adding transition");
              target->maxTransTo = target->maxTransTo / 2;
              return;
            }
            target->transTo = piVar6;
          }
          piVar6[target->nbTransTo] = iVar2;
          target->nbTransTo = target->nbTransTo + 1;
          return;
        }
        pxVar5 = state->trans;
        if ((((*(xmlRegAtomPtr *)((long)pxVar5 + lVar4 + -0x10) == atom) &&
             (*(int *)((long)pxVar5 + lVar4 + -8) == target->no)) &&
            (*(int *)((long)pxVar5 + lVar4 + -4) == counter)) &&
           (*(int *)((long)&pxVar5->atom + lVar4) == count)) break;
        uVar7 = uVar7 - 1;
        lVar4 = lVar4 + -0x18;
      }
      return;
    }
    ctxt->error = 0x5aa;
    extra = "add state: target is NULL";
  }
  xmlRegexpErrCompile(ctxt,extra);
  return;
}

Assistant:

static void
xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	            xmlRegAtomPtr atom, xmlRegStatePtr target,
		    int counter, int count) {

    int nrtrans;

    if (state == NULL) {
	ERROR("add state: state is NULL");
	return;
    }
    if (target == NULL) {
	ERROR("add state: target is NULL");
	return;
    }
    /*
     * Other routines follow the philosophy 'When in doubt, add a transition'
     * so we check here whether such a transition is already present and, if
     * so, silently ignore this request.
     */

    for (nrtrans = state->nbTrans - 1; nrtrans >= 0; nrtrans--) {
	xmlRegTransPtr trans = &(state->trans[nrtrans]);
	if ((trans->atom == atom) &&
	    (trans->to == target->no) &&
	    (trans->counter == counter) &&
	    (trans->count == count)) {
#ifdef DEBUG_REGEXP_GRAPH
	    printf("Ignoring duplicate transition from %d to %d\n",
		    state->no, target->no);
#endif
	    return;
	}
    }

    if (state->maxTrans == 0) {
	state->maxTrans = 8;
	state->trans = (xmlRegTrans *) xmlMalloc(state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (state->trans == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans = 0;
	    return;
	}
    } else if (state->nbTrans >= state->maxTrans) {
	xmlRegTrans *tmp;
	state->maxTrans *= 2;
	tmp = (xmlRegTrans *) xmlRealloc(state->trans, state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans /= 2;
	    return;
	}
	state->trans = tmp;
    }
#ifdef DEBUG_REGEXP_GRAPH
    printf("Add trans from %d to %d ", state->no, target->no);
    if (count == REGEXP_ALL_COUNTER)
	printf("all transition\n");
    else if (count >= 0)
	printf("count based %d\n", count);
    else if (counter >= 0)
	printf("counted %d\n", counter);
    else if (atom == NULL)
	printf("epsilon transition\n");
    else if (atom != NULL)
        xmlRegPrintAtom(stdout, atom);
#endif

    state->trans[state->nbTrans].atom = atom;
    state->trans[state->nbTrans].to = target->no;
    state->trans[state->nbTrans].counter = counter;
    state->trans[state->nbTrans].count = count;
    state->trans[state->nbTrans].nd = 0;
    state->nbTrans++;
    xmlRegStateAddTransTo(ctxt, target, state->no);
}